

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O2

void __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConsiderMarkingResultVar<mp::LinearFunctionalConstraint>
          (Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,LinearFunctionalConstraint *con,int i,ExpressionAcceptanceLevel eal)

{
  int res_var;
  bool bVar1;
  _Invoker_type *this_00;
  
  res_var = (con->super_FunctionalConstraint).result_var_;
  if (-1 < res_var) {
    this_00 = &this[-8].MarkVarIfLogical_._M_invoker;
    bVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::IfVarBoundsStrongerThanInitExpr
                      ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                        *)this_00,res_var);
    if (!bVar1) {
      FlatModel<mp::DefaultFlatModelParams>::MarkAsExpression
                ((FlatModel<mp::DefaultFlatModelParams> *)this_00,
                 (con->super_FunctionalConstraint).result_var_);
      return;
    }
  }
  return;
}

Assistant:

void ConsiderMarkingResultVar(
      const Con& con, int i, ExpressionAcceptanceLevel eal) {
    assert(ExpressionAcceptanceLevel::NotAccepted!=eal);
    if (con.HasResultVar()) {         // A functional constraint
      assert(                     // Check: the result var has \a con as the init expr
          MPD( template GetInitExpressionOfType<Con>(con.GetResultVar()) )
          == &con);
      if (con.IsLogical()         // Fixed logical results handled differently
          || !MPD( IfVarBoundsStrongerThanInitExpr(con.GetResultVar()) ) )
        MPD( MarkAsExpression(con.GetResultVar()) );   // can be changed later
    }
  }